

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field.cpp
# Opt level: O2

bool __thiscall bidfx_public_api::price::PriceField::operator==(PriceField *this,PriceField *pf)

{
  undefined1 uVar1;
  
  uVar1 = (*(code *)(&DAT_001df5dc + *(int *)(&DAT_001df5dc + (ulong)this->type_ * 4)))();
  return (bool)uVar1;
}

Assistant:

const bool PriceField::operator==(const PriceField &pf) const
{
    switch(type_)
    {
        case INTEGER:
            switch(pf.type_)
            {
                case INTEGER:
                    return int_value_ == pf.int_value_;
                case LONG:
                    return int_value_ == pf.long_value_;
                case DOUBLE:
                    return int_value_ == pf.double_value_;
                default:
                    return false;
            }
        case LONG:
            switch(pf.type_)
            {
                case INTEGER:
                    return long_value_ == pf.int_value_;
                case LONG:
                    return long_value_ == pf.long_value_;
                case DOUBLE:
                    return long_value_ == pf.double_value_;
                default:
                    return false;
            }
        case DOUBLE:
            switch(pf.type_)
            {
                case INTEGER:
                    return double_value_ == pf.int_value_;
                case LONG:
                    return double_value_ == pf.long_value_;
                case DOUBLE:
                    return double_value_ == pf.double_value_;
                default:
                    return false;
            }
        case STRING:
            switch (pf.type_)
            {
                case STRING:
                    return *string_value_ == *pf.string_value_;
                default:
                    return false;
            }
        case NOTHING:
            return pf.type_ == NOTHING;
    }
}